

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool __thiscall Clasp::mt::SharedLitsClause::simplify(SharedLitsClause *this,Solver *s,bool reinit)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 uVar5;
  uint32 uVar6;
  Literal *pLVar8;
  ulong uVar9;
  Literal *pLVar10;
  SharedLiterals *pSVar11;
  uint *puVar12;
  Literal lits [5];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  ClauseRep local_40;
  int iVar7;
  
  puVar12 = (uint *)&local_58;
  bVar4 = ClauseHead::satisfied(&this->super_ClauseHead,s);
  if ((bVar4) ||
     (uVar6 = SharedLiterals::simplify((this->super_ClauseHead).field_0.shared_,s), uVar6 == 0)) {
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x12])(this,s);
    uVar5 = 1;
  }
  else if (uVar6 < 6) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    pSVar11 = (this->super_ClauseHead).field_0.shared_;
    uVar1 = pSVar11->size_type_;
    if (3 < uVar1) {
      puVar3 = (s->assign_).assign_.ebo_.buf;
      uVar9 = 0;
      puVar12 = (uint *)&local_58;
      do {
        uVar2 = *(uint *)((long)&pSVar11[1].refCount_.super___atomic_base<int>._M_i + uVar9);
        if ((byte)(*(byte *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffc)) & 3) !=
            (byte)(((uVar2 & 2) == 0) + 1U)) {
          *puVar12 = uVar2;
          puVar12 = puVar12 + 1;
        }
        uVar9 = uVar9 + 4;
      } while ((uVar1 & 0xfffffffc) != uVar9);
    }
    uVar1 = (this->super_ClauseHead).info_.super_ConstraintScore.rep;
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x12])(this,s);
    pSVar11 = (this->super_ClauseHead).field_0.shared_;
    LOCK();
    (pSVar11->refCount_).super___atomic_base<int>._M_i =
         (pSVar11->refCount_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar11->refCount_).super___atomic_base<int>._M_i == 0) {
      operator_delete(pSVar11);
    }
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x10])(this);
    local_40._0_8_ =
         ((long)puVar12 - (long)&local_58) * 0x40000000 & 0x7fffffff00000000U | (ulong)uVar1 |
         0x8000000000000000;
    local_40.lits = (Literal *)&local_58;
    Clause::Clause((Clause *)this,s,&local_40,0xffffffff,false);
    iVar7 = (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[4])(this,s,(ulong)reinit);
    uVar5 = (undefined1)iVar7;
  }
  else {
    uVar1 = (this->super_ClauseHead).head_[2].rep_;
    uVar5 = 0;
    if ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3) ==
        (byte)(((uVar1 & 2) == 0) + 1U)) {
      pSVar11 = (this->super_ClauseHead).field_0.shared_;
      uVar1 = pSVar11->size_type_;
      if (uVar1 < 4) {
LAB_0018615d:
        uVar5 = 0;
      }
      else {
        pLVar10 = (this->super_ClauseHead).head_ + 2;
        uVar9 = (ulong)(uVar1 & 0xfffffffc);
        pSVar11 = pSVar11 + 1;
        do {
          uVar1 = (pSVar11->refCount_).super___atomic_base<int>._M_i;
          if (((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) &
                     3) != (byte)(((uVar1 & 2) == 0) + 1U)) &&
             (pLVar8 = std::
                       __find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                                 ((this->super_ClauseHead).head_,pLVar10,pSVar11), pLVar8 == pLVar10
             )) {
            pLVar10->rep_ = (pSVar11->refCount_).super___atomic_base<int>._M_i;
            goto LAB_0018615d;
          }
          pSVar11 = (SharedLiterals *)&pSVar11->size_type_;
          uVar5 = 0;
          uVar9 = uVar9 - 4;
        } while (uVar9 != 0);
      }
    }
  }
  return (bool)uVar5;
}

Assistant:

bool SharedLitsClause::simplify(Solver& s, bool reinit) {
	if (ClauseHead::satisfied(s)) {
		detach(s);
		return true;
	}
	uint32 optSize = shared_->simplify(s);
	if (optSize == 0) {
		detach(s);
		return true;
	}
	else if (optSize <= Clause::MAX_SHORT_LEN) {
		Literal lits[Clause::MAX_SHORT_LEN];
		Literal* j = lits;
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r)) *j++ = *r;
		}
		// safe extra data
		InfoType myInfo = info_;
		// detach & destroy but do not release memory
		detach(s);
		SharedLitsClause::destroy(0, false);
		// construct short clause in "this"
		ClauseHead* h = Clause::newClause(this, s, ClauseRep::prepared(lits, static_cast<uint32>(j-lits), myInfo));
		return h->simplify(s, reinit);
	}
	else if (s.isFalse(head_[2])) {
		// try to replace cache lit with non-false literal
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r) && std::find(head_, head_+2, *r) == head_+2) {
				head_[2] = *r;
				break;
			}
		}
	}
	return false;
}